

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool __thiscall Input::b1(Input *this)

{
  bool bVar1;
  char cVar2;
  undefined1 uVar3;
  
  bVar1 = is_joypad_connected();
  if (bVar1) {
    uVar3 = this->joypad_b;
  }
  else {
    cVar2 = al_key_down(&this->kbdstate,0x1a);
    uVar3 = 1;
    if (cVar2 == '\0') {
      cVar2 = al_key_down(&this->kbdstate,0x19);
      if (cVar2 == '\0') {
        if (this->joystick == (ALLEGRO_JOYSTICK *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (this->joystate).button[0] != 0;
        }
      }
    }
  }
  return (bool)uVar3;
}

Assistant:

bool Input::b1(void)
{
   if (is_joypad_connected()) {
      return joypad_b;
   }

#ifdef ALLEGRO_IPHONE
   return button_pressed(BB_W-size, BB_H-size, size, size) ? 1 : 0;
#else
   if (al_key_down(&kbdstate, ALLEGRO_KEY_Z) || al_key_down(&kbdstate, ALLEGRO_KEY_Y))
      return true;
   else if (joystick)
      return joystate.button[0];
   else
      return 0;
#endif
}